

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

bool __thiscall cvm::BasicValue::toBool(BasicValue *this)

{
  byte bVar1;
  BasicValue *this_local;
  
  switch(this->Type) {
  case BoolType:
    this_local._7_1_ = (bool)((this->field_2).BoolVal & 1);
    break;
  case IntType:
    this_local._7_1_ = (this->field_2).IntVal != 0;
    break;
  case DoubleType:
    this_local._7_1_ = (this->field_2).DoubleVal != 0.0;
    break;
  case StringType:
    bVar1 = std::__cxx11::string::empty();
    this_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BasicValue::toBool() const {
  switch (Type) {
  default:          return false;
  case IntType:     return IntVal != 0;
  case DoubleType:  return DoubleVal != 0.0;
  case BoolType:    return BoolVal;
  case StringType:  return !StrVal.empty();
  }
}